

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

bool __thiscall QProcess::waitForBytesWritten(QProcess *this,int msecs)

{
  bool bVar1;
  QProcessPrivate *pQVar2;
  long in_FS_OFFSET;
  bool started;
  QProcessPrivate *d;
  QDeadlineTimer deadline;
  qint64 in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  bool local_19;
  QDeadlineTimer *deadline_00;
  QProcessPrivate *this_00;
  QProcessPrivate *this_01;
  
  this_01 = *(QProcessPrivate **)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QProcess *)0x791829);
  if (pQVar2->processState == '\0') {
    local_19 = false;
  }
  else {
    deadline_00 = (QDeadlineTimer *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QProcessPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QDeadlineTimer::QDeadlineTimer
              ((QDeadlineTimer *)
               CONCAT17(in_stack_ffffffffffffffc7,
                        CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
               in_stack_ffffffffffffffb8,PreciseTimer);
    if ((pQVar2->processState != '\x01') ||
       (bVar1 = QProcessPrivate::waitForStarted(this_00,deadline_00), bVar1)) {
      local_19 = QProcessPrivate::waitForBytesWritten(this_01,(QDeadlineTimer *)this_00);
    }
    else {
      local_19 = false;
    }
  }
  if (*(QProcessPrivate **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool QProcess::waitForBytesWritten(int msecs)
{
    Q_D(QProcess);
    if (d->processState == QProcess::NotRunning)
        return false;

    QDeadlineTimer deadline(msecs);
    if (d->processState == QProcess::Starting) {
        bool started = d->waitForStarted(deadline);
        if (!started)
            return false;
    }

    return d->waitForBytesWritten(deadline);
}